

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSender.cpp
# Opt level: O2

void __thiscall unixsocketipc::MessageSender::MessageSender(MessageSender *this)

{
  this->_vptr_MessageSender = (_func_int **)&PTR__MessageSender_00104da8;
  (this->socket_filename)._M_dataplus._M_p = (pointer)&(this->socket_filename).field_2;
  (this->socket_filename)._M_string_length = 0;
  (this->socket_filename).field_2._M_local_buf[0] = '\0';
  this->server_socket_fd = 0;
  (this->mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  return;
}

Assistant:

MessageSender::MessageSender() {
}